

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O1

void __thiscall cursespp::ShortcutsWindow::RemoveAll(ShortcutsWindow *this)

{
  std::
  vector<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ::clear(&this->entries);
  std::__cxx11::string::_M_replace
            ((ulong)&this->originalKey,0,(char *)(this->originalKey)._M_string_length,0x188174);
  std::__cxx11::string::_M_assign((string *)&this->activeKey);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
  return;
}

Assistant:

void ShortcutsWindow::RemoveAll() {
    this->entries.clear();
    this->activeKey = this->originalKey = "";
    this->Redraw();
}